

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssignmentExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>
          (AssignmentExpression *this,MonitorVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<slang::ast::builtins::MonitorVisitor>(this->timingControl,visitor);
  }
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::builtins::MonitorVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }